

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_riff_midi.cpp
# Opt level: O1

bool midi_processor::process_riff_midi_count
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,size_t *track_count)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  byte unaff_BPL;
  ulong uVar4;
  pointer puVar5;
  pointer puVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> midi_file;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  *track_count = 0;
  puVar6 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = puVar6 + (ulong)*(uint *)(puVar6 + 4) + 8;
  puVar6 = puVar6 + 0xc;
  do {
    if ((puVar6 == puVar5) || ((long)puVar5 - (long)puVar6 < 8)) {
      unaff_BPL = 0;
      break;
    }
    uVar3 = (ulong)((uint)puVar6[7] << 0x18 | (uint)puVar6[6] << 0x10 | (uint)puVar6[5] << 8 |
                   (uint)puVar6[4]);
    if ((ulong)((long)puVar5 - (long)puVar6) < uVar3) {
      bVar1 = false;
      unaff_BPL = 0;
    }
    else {
      if (*puVar6 == 'd') {
        uVar2 = 0;
        do {
          uVar4 = uVar2;
          if (uVar4 == 3) break;
          uVar2 = uVar4 + 1;
        } while ((uint)puVar6[uVar4 + 1] == (int)"data"[uVar4 + 1]);
        if (2 < uVar4) {
          local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,puVar6 + 8,
                     puVar6 + uVar3 + 8);
          unaff_BPL = process_standard_midi_count(&local_48,track_count);
          if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          bVar1 = false;
          goto LAB_001109c3;
        }
      }
      puVar6 = puVar6 + uVar3 + (puVar6 + uVar3 != puVar5 & puVar6[4]);
      bVar1 = true;
    }
LAB_001109c3:
  } while (bVar1);
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool midi_processor::process_riff_midi_count( std::vector<uint8_t> const& p_file, size_t & track_count )
{
    track_count = 0;

    uint32_t file_size = p_file[ 4 ] | ( p_file[ 5 ] << 8 ) | ( p_file[ 6 ] << 16 ) | ( p_file[ 7 ] << 24 );

    std::vector<uint8_t>::const_iterator it = p_file.begin() + 12;

    std::vector<uint8_t>::const_iterator body_end = p_file.begin() + 8 + file_size;

    std::vector<uint8_t> extra_buffer;

    while ( it != body_end )
    {
        if ( body_end - it < 8 ) return false;
        uint32_t chunk_size = it[ 4 ] | ( it[ 5 ] << 8 ) | ( it[ 6 ] << 16 ) | ( it[ 7 ] << 24 );
        if ( (unsigned long)(body_end - it) < chunk_size ) return false;
        if ( it_equal(it, "data", 4) )
        {
            std::vector<uint8_t> midi_file;
            midi_file.assign( it + 8, it + 8 + chunk_size );
            return process_standard_midi_count( midi_file, track_count );
        }
        else
        {
            it += chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
    }

    return false;
}